

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

bool cvui::mouse(String *theWindowName,int theQuery)

{
  undefined1 uVar1;
  cvui_context_t *pcVar2;
  
  pcVar2 = internal::getContext(theWindowName);
  uVar1 = 0;
  switch(theQuery) {
  case 2:
    uVar1 = (pcVar2->mouse).anyButton.justPressed;
    break;
  case 3:
  case 6:
    uVar1 = (pcVar2->mouse).anyButton.justReleased;
    break;
  case 7:
    uVar1 = (pcVar2->mouse).anyButton.pressed;
  }
  return (bool)uVar1;
}

Assistant:

bool mouse(const cv::String& theWindowName, int theQuery) {
	cvui_mouse_btn_t& aButton = internal::getContext(theWindowName).mouse.anyButton;
	bool aRet = internal::isMouseButton(aButton, theQuery);

	return aRet;
}